

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_IgnoredRepeatedModifyTest_Test::TestBody
          (ComparisonTest_IgnoredRepeatedModifyTest_Test *this)

{
  RepeatedField<int> *pRVar1;
  byte *pbVar2;
  Arena *arena;
  char *message;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  string local_38;
  
  pRVar1 = &(this->super_ComparisonTest).proto1diff_.field_0._impl_.rv_;
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,4);
  pRVar1 = &(this->super_ComparisonTest).proto2diff_.field_0._impl_.rv_;
  RepeatedField<int>::Add(pRVar1,3);
  RepeatedField<int>::Add(pRVar1,5);
  pbVar2 = (byte *)((long)&(this->super_ComparisonTest).proto2diff_.field_0 + 0x18);
  *pbVar2 = *pbVar2 | 1;
  arena = (Arena *)(this->super_ComparisonTest).proto2diff_.super_Message.super_MessageLite.
                   _internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&(this->super_ComparisonTest).proto2diff_.field_0._impl_.w_,"foo",arena);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"rv",(allocator<char> *)&gtest_ar);
  std::__cxx11::string::_M_assign((string *)&(this->super_ComparisonTest).ignored_field_);
  std::__cxx11::string::~string((string *)&local_38);
  protobuf::(anonymous_namespace)::ComparisonTest::RunDiff_abi_cxx11_(&local_38,this);
  testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"ignored: rv\\n\" \"added: w: \\\"foo\\\"\\n\"","RunDiff()",
             (char (*) [29])"ignored: rv\nadded: w: \"foo\"\n",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xe43,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ComparisonTest, IgnoredRepeatedModifyTest) {
  proto1diff_.add_rv(3);
  proto1diff_.add_rv(4);

  proto2diff_.add_rv(3);
  proto2diff_.add_rv(5);

  proto2diff_.set_w("foo");

  ignore_field("rv");

  EXPECT_EQ(
      "ignored: rv\n"
      "added: w: \"foo\"\n",
      RunDiff());
}